

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void console::replace_last(char ch)

{
  undefined7 in_register_00000039;
  
  fprintf(out,"\b%c",CONCAT71(in_register_00000039,ch) & 0xffffffff);
  return;
}

Assistant:

static void replace_last(char ch) {
#if defined(_WIN32)
        pop_cursor();
        put_codepoint(&ch, 1, 1);
#else
        fprintf(out, "\b%c", ch);
#endif
    }